

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O2

int chrono::collision::split_geometries
              (vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
               *mgeos,int firstgeo,int ngeos,PQP_REAL *a,PQP_REAL c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pointer ppCVar3;
  ChGeometry *pCVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Vector vg;
  
  lVar7 = (long)firstgeo;
  iVar8 = 0;
  uVar9 = (ulong)(uint)(~(ngeos >> 0x1f) & ngeos);
  while (bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
    (*(mgeos->
      super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
      )._M_impl.super__Vector_impl_data._M_start[lVar7]->_vptr_ChGeometry[6])(&vg);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = vg.m_data[0];
    auVar13._8_8_ = 0;
    auVar13._0_8_ = vg.m_data[2];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *a;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = vg.m_data[1] * a[1];
    auVar1 = vfmadd231sd_fma(auVar12,auVar11,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = a[2];
    auVar1 = vfmadd231sd_fma(auVar1,auVar13,auVar2);
    if (auVar1._0_8_ <= c) {
      ppCVar3 = (mgeos->
                super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      iVar6 = firstgeo + iVar8;
      pCVar4 = ppCVar3[lVar7];
      iVar8 = iVar8 + 1;
      ppCVar3[lVar7] = ppCVar3[iVar6];
      (mgeos->
      super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
      )._M_impl.super__Vector_impl_data._M_start[iVar6] = pCVar4;
    }
    lVar7 = lVar7 + 1;
  }
  iVar6 = iVar8;
  if (iVar8 == ngeos) {
    iVar6 = ngeos / 2;
  }
  iVar5 = ngeos / 2;
  if (iVar8 != 0) {
    iVar5 = iVar6;
  }
  return iVar5;
}

Assistant:

int split_geometries(std::vector<geometry::ChGeometry*>& mgeos, int firstgeo, int ngeos, PQP_REAL a[3], PQP_REAL c) {
    int c1 = 0;
    PQP_REAL p[3];
    PQP_REAL x;
    geometry::ChGeometry* temp;

    for (int count = 0; count < ngeos; count++) {
        int i = count + firstgeo;

        // loop invariant: up to (but not including) index c1 in group 1,
        // then up to (but not including) index i in group 2
        //
        //  [1] [1] [1] [1] [2] [2] [2] [x] [x] ... [x]
        //                   c1          i
        //
        Vector vg = mgeos[i]->Baricenter();
        p[0] = vg.x();
        p[1] = vg.y();
        p[2] = vg.z();

        x = VdotV(p, a);

        if (x <= c) {
            // group 1
            temp = mgeos[i];
            mgeos[i] = mgeos[firstgeo + c1];
            mgeos[firstgeo + c1] = temp;
            c1++;
        } else {
            // group 2 -- do nothing
        }
    }

    // split arbitrarily if one group empty

    if ((c1 == 0) || (c1 == ngeos))
        c1 = ngeos / 2;

    return c1;
}